

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O2

CharCount __thiscall
UnifiedRegex::ConcatNode::TransferPass0(ConcatNode *this,Compiler *compiler,Char *litbuf)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint32 rhs;
  uint32 lhs;
  undefined4 *puVar4;
  ConcatNode *curr;
  ConcatNode *pCVar5;
  ConcatNode *pCVar6;
  
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  if (this->tail == (ConcatNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x70a,"(tail != 0)","tail != 0");
    if (!bVar2) {
LAB_00d11c1c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  else {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  lhs = 0;
  pCVar6 = (ConcatNode *)0x0;
  do {
    pCVar5 = this;
    if (pCVar5 == (ConcatNode *)0x0) {
      return lhs;
    }
    if (pCVar5->head->tag == Concat) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x711,"(curr->head->tag != Concat)","curr->head->tag != Concat");
      if (!bVar2) goto LAB_00d11c1c;
      *puVar4 = 0;
    }
    if (pCVar6 != (ConcatNode *)0x0) {
      iVar3 = (**pCVar6->head->_vptr_Node)();
      if (iVar3 != 0) {
        iVar3 = (**pCVar5->head->_vptr_Node)();
        if (iVar3 != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                             ,0x712,
                             "(prev == 0 || !(prev->head->LiteralLength() > 0 && curr->head->LiteralLength() > 0))"
                             ,
                             "prev == 0 || !(prev->head->LiteralLength() > 0 && curr->head->LiteralLength() > 0)"
                            );
          if (!bVar2) goto LAB_00d11c1c;
          *puVar4 = 0;
        }
      }
    }
    rhs = (*pCVar5->head->_vptr_Node[3])(pCVar5->head,compiler,litbuf);
    lhs = UInt32Math::Add(lhs,rhs);
    this = pCVar5->tail;
    pCVar6 = pCVar5;
  } while( true );
}

Assistant:

CharCount ConcatNode::TransferPass0(Compiler& compiler, const Char* litbuf)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        Assert(tail != 0);
        CharCount n = 0;
#if DBG
        ConcatNode* prev = 0;
#endif
        for (ConcatNode* curr = this; curr != 0; curr = curr->tail)
        {
            Assert(curr->head->tag != Concat);
            Assert(prev == 0 || !(prev->head->LiteralLength() > 0 && curr->head->LiteralLength() > 0));
            n = UInt32Math::Add(n, curr->head->TransferPass0(compiler, litbuf));
#if DBG
            prev = curr;
#endif
        }
        return n;
    }